

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyaddr.c
# Opt level: O0

void ares_gethostbyaddr_nolock
               (ares_channel_t *channel,void *addr,int addrlen,int family,
               ares_host_callback callback,void *arg)

{
  addr_query *aquery_00;
  char *pcVar1;
  addr_query *aquery;
  void *arg_local;
  ares_host_callback callback_local;
  int family_local;
  int addrlen_local;
  void *addr_local;
  ares_channel_t *channel_local;
  
  if ((family == 2) || (family == 10)) {
    if (((family == 2) && (addrlen != 4)) || ((family == 10 && (addrlen != 0x10)))) {
      (*callback)(arg,5,0,(hostent *)0x0);
    }
    else {
      aquery_00 = (addr_query *)ares_malloc(0x48);
      if (aquery_00 == (addr_query *)0x0) {
        (*callback)(arg,0xf,0,(hostent *)0x0);
      }
      else {
        pcVar1 = ares_strdup(channel->lookups);
        aquery_00->lookups = pcVar1;
        if (aquery_00->lookups == (char *)0x0) {
          ares_free(aquery_00);
          (*callback)(arg,0xf,0,(hostent *)0x0);
        }
        else {
          aquery_00->channel = channel;
          if (family == 2) {
            (aquery_00->addr).addr.addr4.s_addr = *addr;
          }
          else {
            *(undefined8 *)&(aquery_00->addr).addr = *addr;
            *(undefined8 *)((long)&(aquery_00->addr).addr + 8) = *(undefined8 *)((long)addr + 8);
          }
          (aquery_00->addr).family = family;
          aquery_00->callback = callback;
          aquery_00->arg = arg;
          aquery_00->remaining_lookups = aquery_00->lookups;
          aquery_00->timeouts = 0;
          next_lookup(aquery_00);
        }
      }
    }
  }
  else {
    (*callback)(arg,5,0,(hostent *)0x0);
  }
  return;
}

Assistant:

void ares_gethostbyaddr_nolock(ares_channel_t *channel, const void *addr,
                               int addrlen, int family,
                               ares_host_callback callback, void *arg)
{
  struct addr_query *aquery;

  if (family != AF_INET && family != AF_INET6) {
    callback(arg, ARES_ENOTIMP, 0, NULL);
    return;
  }

  if ((family == AF_INET && addrlen != sizeof(aquery->addr.addr.addr4)) ||
      (family == AF_INET6 && addrlen != sizeof(aquery->addr.addr.addr6))) {
    callback(arg, ARES_ENOTIMP, 0, NULL);
    return;
  }

  aquery = ares_malloc(sizeof(struct addr_query));
  if (!aquery) {
    callback(arg, ARES_ENOMEM, 0, NULL);
    return;
  }
  aquery->lookups = ares_strdup(channel->lookups);
  if (aquery->lookups == NULL) {
    /* LCOV_EXCL_START: OutOfMemory */
    ares_free(aquery);
    callback(arg, ARES_ENOMEM, 0, NULL);
    return;
    /* LCOV_EXCL_STOP */
  }
  aquery->channel = channel;
  if (family == AF_INET) {
    memcpy(&aquery->addr.addr.addr4, addr, sizeof(aquery->addr.addr.addr4));
  } else {
    memcpy(&aquery->addr.addr.addr6, addr, sizeof(aquery->addr.addr.addr6));
  }
  aquery->addr.family       = family;
  aquery->callback          = callback;
  aquery->arg               = arg;
  aquery->remaining_lookups = aquery->lookups;
  aquery->timeouts          = 0;

  next_lookup(aquery);
}